

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

void client_set_window_input_focus(natwm_state *state,xcb_window_t window)

{
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar1;
  xcb_window_t window_local;
  natwm_state *state_local;
  
  uVar1 = 0x107e34;
  ewmh_update_active_window(state,window);
  xcb_set_input_focus(state->xcb,1,window,0,in_R8,in_R9,uVar1);
  update_stack_mode(state,window,XCB_STACK_MODE_ABOVE);
  return;
}

Assistant:

void client_set_window_input_focus(const struct natwm_state *state, xcb_window_t window)
{
        ewmh_update_active_window(state, window);

        xcb_set_input_focus(
                state->xcb, XCB_INPUT_FOCUS_POINTER_ROOT, window, XCB_TIME_CURRENT_TIME);

        update_stack_mode(state, window, XCB_STACK_MODE_ABOVE);
}